

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O0

void Imf_2_5::loadDeepImage(string *fileName,Header *hdr,DeepImage *img)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ArgExc *pAVar4;
  string *name;
  string *in_RDI;
  MultiPartInputFile mpi;
  stringstream _iex_throw_s_2;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  bool multiPart;
  bool deep;
  bool tiled;
  int in_stack_fffffffffffffa9c;
  MultiPartInputFile *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffac0;
  bool *in_stack_fffffffffffffae0;
  bool *in_stack_fffffffffffffae8;
  bool *in_stack_fffffffffffffaf0;
  char *in_stack_fffffffffffffaf8;
  stringstream local_4c8 [16];
  ostream local_4b8 [184];
  DeepImage *in_stack_fffffffffffffc00;
  Header *in_stack_fffffffffffffc08;
  string *in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc83;
  int in_stack_fffffffffffffc84;
  char *in_stack_fffffffffffffc88;
  MultiPartInputFile *in_stack_fffffffffffffc90;
  stringstream local_340 [16];
  ostream local_330 [112];
  DeepImage *in_stack_fffffffffffffd40;
  Header *in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd50;
  stringstream local_1a8 [16];
  ostream local_198 [381];
  byte local_1b;
  byte local_1a;
  byte local_19;
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::c_str();
  bVar1 = isOpenExrFile(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                        in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar3 = std::operator<<(local_198,"Cannot load image file ");
    poVar3 = std::operator<<(poVar3,local_8);
    std::operator<<(poVar3,".  The file is not an OpenEXR file.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,local_1a8);
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if ((local_1b & 1) == 0) {
    if ((local_1a & 1) != 0) {
      std::__cxx11::string::c_str();
      globalThreadCount();
      MultiPartInputFile::MultiPartInputFile
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,
                 (bool)in_stack_fffffffffffffc83);
      iVar2 = MultiPartInputFile::parts((MultiPartInputFile *)0x137052);
      local_19 = false;
      if (0 < iVar2) {
        MultiPartInputFile::header(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        bVar1 = Header::hasType((Header *)0x137087);
        local_19 = false;
        if (bVar1) {
          MultiPartInputFile::header(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
          name = Header::type_abi_cxx11_((Header *)0x1370be);
          local_19 = isTiled(name);
        }
      }
      MultiPartInputFile::~MultiPartInputFile
                ((MultiPartInputFile *)CONCAT17(local_19,in_stack_fffffffffffffac0));
      if ((local_19 & 1) == 0) {
        loadDeepScanLineImage
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      }
      else {
        loadDeepTiledImage(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                           in_stack_fffffffffffffc00);
      }
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_4c8);
    poVar3 = std::operator<<(local_4b8,"Cannot load flat image file ");
    poVar3 = std::operator<<(poVar3,local_8);
    std::operator<<(poVar3," as a deep image.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,local_4c8);
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_340);
  poVar3 = std::operator<<(local_330,"Cannot load image file ");
  poVar3 = std::operator<<(poVar3,local_8);
  std::operator<<(poVar3,".  Multi-part file loading is not supported.");
  pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar4,local_340);
  __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
loadDeepImage
    (const string &fileName,
     Header &hdr,
     DeepImage &img)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str(), tiled, deep, multiPart))
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "Multi-part file loading is not supported.");
    }

    if (!deep)
    {
        THROW (ArgExc, "Cannot load flat image file " << fileName << " "
                       "as a deep image.");
    }

    //XXX TODO: the tiled flag obtained above is unreliable;
    // open the file as a multi-part file and inspect the header.
    // Can the IlmImf library be fixed?

    {
        MultiPartInputFile mpi (fileName.c_str());

        tiled = (mpi.parts() > 0 &&
                 mpi.header(0).hasType() &&
                 isTiled (mpi.header(0).type()));
    }

    if (tiled)
        loadDeepTiledImage (fileName, hdr, img);
    else
        loadDeepScanLineImage (fileName, hdr, img);
}